

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_stream.hpp
# Opt level: O3

basic_binary_istream<fail_flag_serialization_policy> *
detail::operator>>(istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                   *stream,vector<int,_std::allocator<int>_> *value)

{
  basic_binary_istream<fail_flag_serialization_policy> *pbVar1;
  byte *pbVar2;
  undefined8 __new_size;
  size_t __n;
  span<const_std::byte> buffer;
  pair<unsigned_long,_bool> pVar3;
  
  pbVar1 = (basic_binary_istream<fail_flag_serialization_policy> *)(stream + -0x10);
  if ((stream->
      super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow == false) {
    pbVar2 = *(byte **)(stream + -0x10);
    if (*(long *)(stream + -8) - (long)pbVar2 < 0) {
      __assert_fail("diff >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/src/include/span.hpp"
                    ,0x22,"size_t span<const std::byte>::size() const [T = const std::byte]");
    }
    buffer.end_ = pbVar2 + (*(long *)(stream + -8) - (long)pbVar2);
    buffer.begin_ = pbVar2;
    pVar3 = try_get_deserialized_size<std::vector<int,std::allocator<int>>>(buffer);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (stream->
      super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow = true;
    }
    else {
      pbVar2 = (pbVar1->super_span<const_std::byte>).begin_;
      __new_size = *(undefined8 *)pbVar2;
      (pbVar1->super_span<const_std::byte>).begin_ = pbVar2 + 8;
      std::vector<int,_std::allocator<int>_>::resize(value,__new_size);
      __n = __new_size * 4;
      memcpy((value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(pbVar1->super_span<const_std::byte>).begin_,__n);
      (pbVar1->super_span<const_std::byte>).begin_ =
           (pbVar1->super_span<const_std::byte>).begin_ + __n;
    }
  }
  return pbVar1;
}

Assistant:

StreamDerived& operator>>(istream_mixin<StreamDerived, SpanBase, fail_flag_serialization_policy>& stream, T& value) {
        if (stream.overflow) return stream.base();

        auto const [_, success] = try_get_deserialized_size<T>(stream.span());
        if (!success) {
            stream.overflow = true;
            return stream.base();
        }
        deserialize(value, stream.span());
        return stream.base();
    }